

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O0

int jpc_pi_next(jpc_pi_t *pi)

{
  int iVar1;
  int iVar2;
  jpc_pchg_t *pjVar3;
  int local_24;
  int ret;
  jpc_pchg_t *pchg;
  jpc_pi_t *pi_local;
  
  while( true ) {
    pi->valid = false;
    if (pi->pchg == (jpc_pchg_t *)0x0) {
      pi->pchgno = pi->pchgno + 1;
      pi->compno = 0;
      pi->rlvlno = 0;
      pi->prcno = 0;
      pi->lyrno = 0;
      pi->prgvolfirst = true;
      iVar1 = pi->pchgno;
      iVar2 = jpc_pchglist_numpchgs(pi->pchglist);
      if (iVar1 < iVar2) {
        pjVar3 = jpc_pchglist_get(pi->pchglist,pi->pchgno);
        pi->pchg = pjVar3;
      }
      else {
        iVar1 = pi->pchgno;
        iVar2 = jpc_pchglist_numpchgs(pi->pchglist);
        if (iVar1 != iVar2) {
          return 1;
        }
        pi->pchg = &pi->defaultpchg;
      }
    }
    switch(pi->pchg->prgord) {
    case '\0':
      local_24 = jpc_pi_nextlrcp(pi);
      break;
    case '\x01':
      local_24 = jpc_pi_nextrlcp(pi);
      break;
    case '\x02':
      local_24 = jpc_pi_nextrpcl(pi);
      break;
    case '\x03':
      local_24 = jpc_pi_nextpcrl(pi);
      break;
    case '\x04':
      local_24 = jpc_pi_nextcprl(pi);
      break;
    default:
      local_24 = -1;
    }
    if (local_24 == 0) break;
    pi->pchg = (jpc_pchg_t *)0x0;
  }
  pi->valid = true;
  pi->pktno = pi->pktno + 1;
  return 0;
}

Assistant:

int jpc_pi_next(jpc_pi_t *pi)
{
	jpc_pchg_t *pchg;
	int ret;

	for (;;) {

		pi->valid = false;

		if (!pi->pchg) {
			++pi->pchgno;
			pi->compno = 0;
			pi->rlvlno = 0;
			pi->prcno = 0;
			pi->lyrno = 0;
			pi->prgvolfirst = true;
			if (pi->pchgno < jpc_pchglist_numpchgs(pi->pchglist)) {
				pi->pchg = jpc_pchglist_get(pi->pchglist, pi->pchgno);
			} else if (pi->pchgno == jpc_pchglist_numpchgs(pi->pchglist)) {
				pi->pchg = &pi->defaultpchg;
			} else {
				return 1;
			}
		}

		pchg = pi->pchg;
		switch (pchg->prgord) {
		case JPC_COD_LRCPPRG:
			ret = jpc_pi_nextlrcp(pi);
			break;
		case JPC_COD_RLCPPRG:
			ret = jpc_pi_nextrlcp(pi);
			break;
		case JPC_COD_RPCLPRG:
			ret = jpc_pi_nextrpcl(pi);
			break;
		case JPC_COD_PCRLPRG:
			ret = jpc_pi_nextpcrl(pi);
			break;
		case JPC_COD_CPRLPRG:
			ret = jpc_pi_nextcprl(pi);
			break;
		default:
			ret = -1;
			break;
		}
		if (!ret) {
			pi->valid = true;
			++pi->pktno;
			return 0;
		}
		pi->pchg = 0;
	}
}